

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_test.cc
# Opt level: O0

UniquePtr<BIGNUM> __thiscall
anon_unknown.dwarf_263068::GetBIGNUM(anon_unknown_dwarf_263068 *this,FileTest *t,char *key)

{
  pointer __s;
  bool bVar1;
  uchar *s;
  size_type sVar2;
  BIGNUM *__p;
  allocator<char> local_59;
  string local_58;
  undefined1 local_38 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  char *key_local;
  FileTest *t_local;
  
  bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)key;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  __s = bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,(char *)__s,&local_59);
  bVar1 = FileTest::GetBytes(t,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,
                             &local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    s = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
    __p = BN_bin2bn(s,(int)sVar2,(BIGNUM *)0x0);
    std::unique_ptr<bignum_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<bignum_st,bssl::internal::Deleter> *)this,(pointer)__p);
  }
  else {
    std::unique_ptr<bignum_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<bignum_st,bssl::internal::Deleter> *)this,(nullptr_t)0x0);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  return (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)this;
}

Assistant:

static bssl::UniquePtr<BIGNUM> GetBIGNUM(FileTest *t, const char *key) {
  std::vector<uint8_t> bytes;
  if (!t->GetBytes(&bytes, key)) {
    return nullptr;
  }

  return bssl::UniquePtr<BIGNUM>(
      BN_bin2bn(bytes.data(), bytes.size(), nullptr));
}